

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_get_rows::build_graph(test_get_rows *this,ggml_context *ctx)

{
  uint uVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  test_case *in_RSI;
  int64_t in_RDI;
  ggml_tensor *out;
  bool grad_supported;
  ggml_tensor *rows;
  ggml_tensor *in;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  byte bVar4;
  int64_t in_stack_ffffffffffffffd0;
  ggml_type type;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  test_case *in_stack_ffffffffffffffe0;
  ggml_context *in_stack_ffffffffffffffe8;
  
  pgVar2 = test_case::ggml_new_tensor_3d
                     (in_RSI,in_stack_ffffffffffffffe8,
                      (ggml_type)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                      CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_RDI);
  type = (ggml_type)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  ggml_set_name(pgVar2,"in");
  pgVar3 = test_case::ggml_new_tensor_2d
                     (in_stack_ffffffffffffffe0,
                      (ggml_context *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                      type,in_RDI,CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  ggml_set_name(pgVar3,"rows");
  if ((*(byte *)(in_RDI + 0x4c) & 1) != 0) {
    pgVar3 = (ggml_tensor *)
             ggml_view_2d(in_RSI,pgVar3,(long)(*(int *)(in_RDI + 0x44) / 2),
                          (long)*(int *)(in_RDI + 0x48),pgVar3->nb[1],0);
    ggml_set_name(pgVar3,"view_of_rows");
  }
  uVar1 = ggml_is_matrix(pgVar2);
  bVar4 = 0;
  if ((uVar1 & 1) != 0) {
    bVar4 = ggml_is_vector(pgVar3);
  }
  if ((bVar4 & 1) != 0) {
    ggml_set_param(in_RSI,pgVar2);
  }
  pgVar2 = (ggml_tensor *)ggml_get_rows(in_RSI,pgVar2,pgVar3);
  ggml_set_name(pgVar2,"out");
  return pgVar2;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * in = ggml_new_tensor_3d(ctx, type, n, m, b);
        ggml_set_name(in, "in");

        ggml_tensor * rows = ggml_new_tensor_2d(ctx, GGML_TYPE_I32, r, b);
        ggml_set_name(rows, "rows");
        if (v) {
            rows = ggml_view_2d(ctx, rows, r/2, b, rows->nb[1], 0);
            ggml_set_name(rows, "view_of_rows");
        }

        const bool grad_supported = ggml_is_matrix(in) && ggml_is_vector(rows);
        if (grad_supported) {
            ggml_set_param(ctx, in);
            // rows is a constant input -> no gradients
        }

        ggml_tensor * out = ggml_get_rows(ctx, in, rows);
        ggml_set_name(out, "out");

        return out;
    }